

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_parameter.hpp
# Opt level: O0

InputParameter<0UL,_ruckig::StandardVector> * __thiscall
ruckig::InputParameter<0UL,_ruckig::StandardVector>::operator=
          (InputParameter<0UL,_ruckig::StandardVector> *this,
          InputParameter<0UL,_ruckig::StandardVector> *param_1)

{
  Synchronization SVar1;
  undefined7 uVar2;
  InputParameter<0UL,_ruckig::StandardVector> *param_1_local;
  InputParameter<0UL,_ruckig::StandardVector> *this_local;
  
  this->degrees_of_freedom = param_1->degrees_of_freedom;
  SVar1 = param_1->synchronization;
  this->control_interface = param_1->control_interface;
  this->synchronization = SVar1;
  this->duration_discretization = param_1->duration_discretization;
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->current_position,&param_1->current_position);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->current_velocity,&param_1->current_velocity);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->current_acceleration,&param_1->current_acceleration);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->target_position,&param_1->target_position);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->target_velocity,&param_1->target_velocity);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->target_acceleration,&param_1->target_acceleration);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->max_velocity,&param_1->max_velocity);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->max_acceleration,&param_1->max_acceleration);
  std::vector<double,_std::allocator<double>_>::operator=(&this->max_jerk,&param_1->max_jerk);
  std::optional<std::vector<double,_std::allocator<double>_>_>::operator=
            (&this->min_velocity,&param_1->min_velocity);
  std::optional<std::vector<double,_std::allocator<double>_>_>::operator=
            (&this->min_acceleration,&param_1->min_acceleration);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&this->intermediate_positions,&param_1->intermediate_positions);
  std::
  optional<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  ::operator=(&this->per_section_max_velocity,&param_1->per_section_max_velocity);
  std::
  optional<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  ::operator=(&this->per_section_max_acceleration,&param_1->per_section_max_acceleration);
  std::
  optional<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  ::operator=(&this->per_section_max_jerk,&param_1->per_section_max_jerk);
  std::
  optional<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  ::operator=(&this->per_section_min_velocity,&param_1->per_section_min_velocity);
  std::
  optional<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  ::operator=(&this->per_section_min_acceleration,&param_1->per_section_min_acceleration);
  std::
  optional<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  ::operator=(&this->per_section_max_position,&param_1->per_section_max_position);
  std::
  optional<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  ::operator=(&this->per_section_min_position,&param_1->per_section_min_position);
  std::optional<std::vector<double,_std::allocator<double>_>_>::operator=
            (&this->max_position,&param_1->max_position);
  std::optional<std::vector<double,_std::allocator<double>_>_>::operator=
            (&this->min_position,&param_1->min_position);
  std::vector<bool,_std::allocator<bool>_>::operator=(&this->enabled,&param_1->enabled);
  std::optional<std::vector<ruckig::ControlInterface,_std::allocator<ruckig::ControlInterface>_>_>::
  operator=(&this->per_dof_control_interface,&param_1->per_dof_control_interface);
  std::optional<std::vector<ruckig::Synchronization,_std::allocator<ruckig::Synchronization>_>_>::
  operator=(&this->per_dof_synchronization,&param_1->per_dof_synchronization);
  (this->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
  super__Optional_payload_base<double>._M_payload =
       (param_1->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
       super__Optional_payload_base<double>._M_payload;
  uVar2 = *(undefined7 *)
           &(param_1->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
            super__Optional_payload_base<double>.field_0x9;
  (this->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
  super__Optional_payload_base<double>._M_engaged =
       (param_1->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
       super__Optional_payload_base<double>._M_engaged;
  *(undefined7 *)
   &(this->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
    super__Optional_payload_base<double>.field_0x9 = uVar2;
  std::optional<std::vector<double,_std::allocator<double>_>_>::operator=
            (&this->per_section_minimum_duration,&param_1->per_section_minimum_duration);
  (this->interrupt_calculation_duration).super__Optional_base<double,_true,_true>._M_payload.
  super__Optional_payload_base<double>._M_payload =
       (param_1->interrupt_calculation_duration).super__Optional_base<double,_true,_true>._M_payload
       .super__Optional_payload_base<double>._M_payload;
  uVar2 = *(undefined7 *)
           &(param_1->interrupt_calculation_duration).super__Optional_base<double,_true,_true>.
            _M_payload.super__Optional_payload_base<double>.field_0x9;
  (this->interrupt_calculation_duration).super__Optional_base<double,_true,_true>._M_payload.
  super__Optional_payload_base<double>._M_engaged =
       (param_1->interrupt_calculation_duration).super__Optional_base<double,_true,_true>._M_payload
       .super__Optional_payload_base<double>._M_engaged;
  *(undefined7 *)
   &(this->interrupt_calculation_duration).super__Optional_base<double,_true,_true>._M_payload.
    super__Optional_payload_base<double>.field_0x9 = uVar2;
  return this;
}

Assistant:

inline static double v_at_a_zero(double v0, double a0, double j) {
        return v0 + (a0 * a0) / (2 * j);
    }